

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

bool __thiscall slang::ConstantRange::overlaps(ConstantRange *this,ConstantRange other)

{
  int32_t iVar1;
  int32_t iVar2;
  undefined1 local_11;
  
  iVar1 = lower((ConstantRange *)0x4eb25d);
  iVar2 = upper((ConstantRange *)0x4eb26b);
  local_11 = false;
  if (iVar1 <= iVar2) {
    iVar1 = upper((ConstantRange *)0x4eb285);
    iVar2 = lower((ConstantRange *)0x4eb293);
    local_11 = iVar2 <= iVar1;
  }
  return local_11;
}

Assistant:

bool ConstantRange::overlaps(ConstantRange other) const {
    return lower() <= other.upper() && upper() >= other.lower();
}